

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  this_00 = &this->os_->stack_;
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(this_00,0x19);
    pcVar3 = internal::dtoa(d,pcVar2,this->maxDecimalPlaces_);
    pGVar1 = this->os_;
    pcVar4 = (pGVar1->stack_).stackTop_;
    if ((ulong)((long)pcVar4 - (long)(pGVar1->stack_).stack_) <
        ((long)pcVar2 - (long)pcVar3) + 0x19U) {
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                    ,0x89,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                   );
    }
    (pGVar1->stack_).stackTop_ = pcVar4 + (-0x19 - ((long)pcVar2 - (long)pcVar3));
LAB_0047f0bd:
    return (ulong)ABS(d) < 0x7ff0000000000000;
  }
  pcVar4 = this_00->stackTop_;
  pcVar2 = this_00->stackEnd_;
  if (pcVar2 < pcVar4 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,3);
    this_00 = &this->os_->stack_;
    pcVar4 = this_00->stackTop_;
    pcVar2 = this_00->stackEnd_;
  }
  if (pcVar4 + 1 <= pcVar2) {
    this_00->stackTop_ = pcVar4 + 1;
    *pcVar4 = '0';
    pGVar1 = this->os_;
    pcVar2 = (pGVar1->stack_).stackTop_;
    pcVar4 = pcVar2 + 1;
    if (pcVar4 <= (pGVar1->stack_).stackEnd_) {
      (pGVar1->stack_).stackTop_ = pcVar4;
      *pcVar2 = '.';
      pGVar1 = this->os_;
      pcVar2 = (pGVar1->stack_).stackTop_;
      pcVar4 = pcVar2 + 1;
      if (pcVar4 <= (pGVar1->stack_).stackEnd_) {
        (pGVar1->stack_).stackTop_ = pcVar4;
        *pcVar2 = '0';
        goto LAB_0047f0bd;
      }
    }
  }
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

inline bool Writer<StringBuffer>::WriteDouble(double d) {
    if (internal::Double(d).IsNanOrInf()) {
        // Note: This code path can only be reached if (RAPIDJSON_WRITE_DEFAULT_FLAGS & kWriteNanAndInfFlag).
		if (!(kWriteDefaultFlags & kWriteNanAndInfFlag))
		{
			// At least ensure that the output does not get broken.
			PutReserve(*os_, 3);
			PutUnsafe(*os_, '0');
			PutUnsafe(*os_, '.');
			PutUnsafe(*os_, '0');
			return false;
		}
        if (internal::Double(d).IsNan()) {
            PutReserve(*os_, 3);
            PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
            return true;
        }
        if (internal::Double(d).Sign()) {
            PutReserve(*os_, 9);
            PutUnsafe(*os_, '-');
        }
        else
            PutReserve(*os_, 8);
        PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
        PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
        return true;
    }
    
    char *buffer = os_->Push(25);
    char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
    os_->Pop(static_cast<size_t>(25 - (end - buffer)));
    return true;
}